

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

Chainstate * __thiscall
ChainstateManager::InitializeChainstate(ChainstateManager *this,CTxMemPool *mempool)

{
  _Head_base<0UL,_Chainstate_*,_false> _Var1;
  optional<uint256> from_snapshot_blockhash;
  _Head_base<0UL,_Chainstate_*,_false> this_00;
  pointer __p;
  long in_FS_OFFSET;
  Chainstate *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_ibd_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) {
    __assert_fail("!m_ibd_chainstate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x15e4,"Chainstate &ChainstateManager::InitializeChainstate(CTxMemPool *)");
  }
  if (this->m_active_chainstate == (Chainstate *)0x0) {
    this_00._M_head_impl = (Chainstate *)operator_new(0xe8);
    local_30 = 0;
    from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_payload._8_8_ = uStack_48;
    from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_payload._0_8_ = local_50;
    from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_payload._16_8_ = local_40;
    from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_payload._24_8_ = uStack_38;
    from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
    Chainstate::Chainstate
              (this_00._M_head_impl,mempool,&this->m_blockman,this,from_snapshot_blockhash);
    local_58 = (Chainstate *)0x0;
    _Var1._M_head_impl =
         (this->m_ibd_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
    (this->m_ibd_chainstate)._M_t.
    super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
    super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
    super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = this_00._M_head_impl;
    if (_Var1._M_head_impl != (Chainstate *)0x0) {
      std::default_delete<Chainstate>::operator()
                ((default_delete<Chainstate> *)this,_Var1._M_head_impl);
    }
    if (local_58 != (Chainstate *)0x0) {
      std::default_delete<Chainstate>::operator()((default_delete<Chainstate> *)&local_58,local_58);
    }
    _Var1._M_head_impl =
         (this->m_ibd_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
    this->m_active_chainstate = _Var1._M_head_impl;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return _Var1._M_head_impl;
    }
    __stack_chk_fail();
  }
  __assert_fail("!m_active_chainstate",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ,0x15e5,"Chainstate &ChainstateManager::InitializeChainstate(CTxMemPool *)");
}

Assistant:

Chainstate& ChainstateManager::InitializeChainstate(CTxMemPool* mempool)
{
    AssertLockHeld(::cs_main);
    assert(!m_ibd_chainstate);
    assert(!m_active_chainstate);

    m_ibd_chainstate = std::make_unique<Chainstate>(mempool, m_blockman, *this);
    m_active_chainstate = m_ibd_chainstate.get();
    return *m_active_chainstate;
}